

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O2

void __thiscall chrono::ChOptimizerGenetic::Mutation(ChOptimizerGenetic *this)

{
  double dVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  Scalar *pSVar5;
  long lVar6;
  bool bVar7;
  int mvar;
  ulong index;
  double dVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  Scalar SVar11;
  undefined1 auVar12 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  uVar4 = (*(this->super_ChOptimizer)._vptr_ChOptimizer[7])();
  for (lVar6 = 0; lVar6 < *(int *)&(this->super_ChOptimizer).field_0x144; lVar6 = lVar6 + 1) {
    bVar7 = false;
    for (index = 0; (~((int)uVar4 >> 0x1f) & uVar4) != index; index = index + 1) {
      dVar8 = ChRandom();
      if (dVar8 <= this->mutation_prob) {
        dVar8 = (this->super_ChOptimizer).xv_sup[index];
        dVar1 = (this->super_ChOptimizer).xv_inf[index];
        if (this->mutation == BOUNDARY) {
          auVar10._0_8_ = ChRandom();
          auVar10._8_56_ = extraout_var_00;
          uVar2 = vcmpsd_avx512f(auVar10._0_16_,ZEXT816(0x3fe0000000000000),1);
          bVar7 = (bool)((byte)uVar2 & 1);
          SVar11 = (Scalar)((ulong)bVar7 * (long)dVar1 + (ulong)!bVar7 * (long)dVar8);
        }
        else {
          SVar11 = 0.0;
          if (this->mutation == UNIFORM) {
            auVar9._0_8_ = ChRandom();
            auVar9._8_56_ = extraout_var;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = dVar1;
            auVar12._8_8_ = 0;
            auVar12._0_8_ = dVar8 - dVar1;
            auVar3 = vfmadd213sd_fma(auVar12,auVar9._0_16_,auVar3);
            SVar11 = auVar3._0_8_;
          }
        }
        pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                            this->population[lVar6],index);
        bVar7 = true;
        *pSVar5 = SVar11;
        this->population[lVar6]->need_eval = true;
      }
    }
    if (bVar7) {
      this->mutants = this->mutants + 1;
    }
  }
  return;
}

Assistant:

void ChOptimizerGenetic::Mutation() {
    int nv = GetNumOfVars();
    double a1, a2, mutval;
    bool had_mutation;

    for (int i = 0; i < popsize; i++) {
        had_mutation = false;
        for (int mvar = 0; mvar < nv; mvar++) {
            if (ChRandom() <= mutation_prob) {
                // MUTATION of the fenotype variable...
                // Find the variable structure in variable linked list, with limits
                a1 = xv_inf[mvar];  // the random value of each variable
                a2 = xv_sup[mvar];  // must lie within the max/min
                // Perform mutation:
                switch (mutation) {
                    case MutationType::UNIFORM:
                        mutval = a1 + ChRandom() * (a2 - a1);
                        break;
                    case MutationType::BOUNDARY:
                        if (ChRandom() < 0.5)
                            mutval = a1;
                        else
                            mutval = a2;
                        break;
                    default:
                        mutval = 0;
                        break;
                }

                // store the mutated allele:
                population[i]->genes(mvar) = mutval;

                // the chromosomes have been changed, remember that
                // new fitness will be computed:
                population[i]->need_eval = true;

                had_mutation = true;
            }
        }
        if (had_mutation)
            mutants++;
    }
}